

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::InverseDistanceWeighting::~InverseDistanceWeighting
          (InverseDistanceWeighting *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/NearestNeighbors.pb.cc"
                 ,0x577);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
      google::protobuf::internal::LogFinisher::operator=(&local_51,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_50);
    }
    if ((this_00->ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
                (this_00);
    }
  }
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__MessageLite_004be5f0;
  google::protobuf::internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

InverseDistanceWeighting::~InverseDistanceWeighting() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.InverseDistanceWeighting)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}